

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

int32_t llama_model_meta_val_str_by_index(llama_model *model,int32_t i,char *buf,size_t buf_size)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  
  if ((-1 < i) && (i < (int)(model->gguf_kv)._M_h._M_element_count)) {
    p_Var2 = (model->gguf_kv)._M_h._M_before_begin._M_nxt;
    if (i != 0) {
      uVar3 = (ulong)(uint)i;
      do {
        p_Var2 = p_Var2->_M_nxt;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    iVar1 = snprintf(buf,buf_size,"%s",p_Var2[5]._M_nxt);
    return iVar1;
  }
  if (buf_size != 0) {
    *buf = '\0';
  }
  return -1;
}

Assistant:

int32_t llama_model_meta_val_str_by_index(const llama_model * model, int32_t i, char * buf, size_t buf_size) {
    if (i < 0 || i >= (int)model->gguf_kv.size()) {
        if (buf_size > 0) {
            buf[0] = '\0';
        }
        return -1;
    }
    auto it = model->gguf_kv.begin();
    std::advance(it, i);
    return snprintf(buf, buf_size, "%s", it->second.c_str());
}